

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_transaction.hpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_>::
transaction_contents
          (transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this,
          not_null<context_*> ctxt,not_null<string_mapping_*> names,not_null<string_mapping_*> paths
          )

{
  context *this_00;
  database *db;
  transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this_local;
  not_null<string_mapping_*> paths_local;
  not_null<string_mapping_*> names_local;
  not_null<context_*> ctxt_local;
  
  names_local.ptr_ = (string_mapping *)ctxt.ptr_;
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__transaction_contents_00237e18;
  this_00 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->
                      ((not_null<pstore::exchange::import_ns::context_*> *)&names_local);
  db = gsl::not_null::operator_cast_to_database_((not_null *)this_00);
  pstore::begin(&this->transaction_,db);
  (this->names_).ptr_ = names.ptr_;
  (this->paths_).ptr_ = paths.ptr_;
  return;
}

Assistant:

transaction_contents (not_null<context *> const ctxt,
                                      not_null<string_mapping *> const names,
                                      not_null<string_mapping *> const paths)
                        : rule (ctxt)
                        , transaction_{begin (*ctxt->db)}
                        , names_{names}
                        , paths_{paths} {}